

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_lsrk_varjac.c
# Opt level: O0

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  double dVar6;
  double dVar7;
  sunrealtype u;
  sunrealtype alpha;
  sunrealtype lambda;
  sunrealtype *rdata;
  
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  pdVar4 = (double *)N_VGetArrayPointer(in_RDI);
  dVar3 = *pdVar4;
  dVar5 = acos(-1.0);
  dVar5 = cos(((10.0 - in_XMM0_Qa) / 10.0) * dVar5);
  dVar6 = acos(-1.0);
  dVar6 = cos(((10.0 - in_XMM0_Qa) / 10.0) * dVar6);
  dVar7 = atan(in_XMM0_Qa);
  pdVar4 = (double *)N_VGetArrayPointer(in_RSI);
  *pdVar4 = -(-dVar2 * dVar6 + dVar1) * dVar7 +
            (-dVar2 * dVar5 + dVar1) * dVar3 + 1.0 / (in_XMM0_Qa * in_XMM0_Qa + 1.0);
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype lambda = rdata[0]; /* set shortcut for stiffness parameter 1 */
  sunrealtype alpha  = rdata[1]; /* set shortcut for stiffness parameter 2 */
  sunrealtype u = N_VGetArrayPointer(y)[0]; /* access current solution value */

  /* fill in the RHS function: "N_VGetArrayPointer" accesses the 0th entry of ydot */
  N_VGetArrayPointer(ydot)[0] =
    (lambda - alpha * COS((SUN_RCONST(10.0) - t) / SUN_RCONST(10.0) *
                          ACOS(SUN_RCONST(-1.0)))) *
      u +
    SUN_RCONST(1.0) / (SUN_RCONST(1.0) + t * t) -
    (lambda - alpha * COS((SUN_RCONST(10.0) - t) / SUN_RCONST(10.0) *
                          ACOS(SUN_RCONST(-1.0)))) *
      ATAN(t);

  return 0; /* return with success */
}